

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

string * __thiscall
mocker::nasm::fmtDirective_abi_cxx11_
          (string *__return_storage_ptr__,nasm *this,shared_ptr<mocker::nasm::Directive> *directive)

{
  shared_ptr<mocker::nasm::Default> *psVar1;
  shared_ptr<mocker::nasm::Default> p;
  shared_ptr<mocker::nasm::Extern> p_2;
  
  std::dynamic_pointer_cast<mocker::nasm::Default,mocker::nasm::Directive>
            ((shared_ptr<mocker::nasm::Directive> *)&p);
  if (p.super___shared_ptr<mocker::nasm::Default,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::nasm::Default,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::dynamic_pointer_cast<mocker::nasm::Global,mocker::nasm::Directive>
              ((shared_ptr<mocker::nasm::Directive> *)&p);
    if (p.super___shared_ptr<mocker::nasm::Default,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<mocker::nasm::Default,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::dynamic_pointer_cast<mocker::nasm::Extern,mocker::nasm::Directive>
                ((shared_ptr<mocker::nasm::Directive> *)&p_2);
      if (p_2.super___shared_ptr<mocker::nasm::Extern,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p_2.super___shared_ptr<mocker::nasm::Extern,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/printer.cpp"
                      ,0x17,
                      "std::string mocker::nasm::fmtDirective(const std::shared_ptr<Directive> &)");
      }
      std::__cxx11::string::string
                ((string *)&p,
                 (string *)
                 &(p_2.super___shared_ptr<mocker::nasm::Extern,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->identifier);
      std::operator+(__return_storage_ptr__,"extern ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
      std::__cxx11::string::~string((string *)&p);
      psVar1 = (shared_ptr<mocker::nasm::Default> *)&p_2;
      goto LAB_001910ef;
    }
    std::operator+(__return_storage_ptr__,"global ",
                   &(p.super___shared_ptr<mocker::nasm::Default,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->mode);
  }
  else {
    std::operator+(__return_storage_ptr__,"default ",
                   &(p.super___shared_ptr<mocker::nasm::Default,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->mode);
  }
  psVar1 = &p;
LAB_001910ef:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(psVar1->super___shared_ptr<mocker::nasm::Default,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string fmtDirective(const std::shared_ptr<Directive> &directive) {
  if (auto p = dyc<Default>(directive))
    return "default " + p->getMode();
  if (auto p = dyc<Global>(directive))
    return "global " + p->getIdentifier();
  if (auto p = dyc<Extern>(directive)) {
#ifdef ONLINE_JUDGE_SUPPORT
    return "";
#endif
    return "extern " + p->getIdentifier();
  }
  assert(false);
}